

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
::solver_equalities_101coeff
          (solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  pointer pmVar2;
  pointer pfVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  float *pfVar7;
  int *__s;
  rc_data *__s_00;
  bound_factor *__s_01;
  undefined8 extraout_RAX;
  long lVar8;
  int iVar9;
  pointer pfVar10;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  string_view name;
  
  name._M_str = "solver_equalities_101coeff";
  name._M_len = 0x1a;
  pvVar11 = csts;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar14 = (ulong)(this->ap).m_rows_values.m_length << 2;
  pfVar7 = (float *)operator_new__(uVar14);
  memset(pfVar7,0,uVar14);
  (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar7;
  __s = (int *)operator_new__(uVar14);
  memset(__s,0,uVar14);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s;
  pmVar2 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar2;
  uVar14 = (long)*(pointer *)
                  ((long)&(pmVar2->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar2->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar8 != 0x28) {
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar21 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar22 = vpbroadcastq_avx512f();
    uVar14 = 0;
    auVar23 = vpbroadcastq_avx512f();
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar22);
      vpmullq_avx512dq(auVar18,auVar20);
      uVar14 = uVar14 + 8;
      auVar18 = vpaddq_avx512f(auVar18,auVar21);
      auVar22 = vporq_avx512f(auVar24,auVar19);
      uVar6 = vpcmpuq_avx512f(auVar22,auVar23,2);
      auVar22 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar2->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar11));
      bVar4 = (byte)uVar6;
      auVar24._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar22._8_8_;
      auVar24._0_8_ = (ulong)(bVar4 & 1) * auVar22._0_8_;
      auVar24._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar22._16_8_;
      auVar24._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar22._24_8_;
      auVar24._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar22._32_8_;
      auVar24._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar22._40_8_;
      auVar24._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar22._48_8_;
      auVar24._56_8_ = (uVar6 >> 7) * auVar22._56_8_;
      auVar22 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar11->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar2->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar26._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar22._8_8_;
      auVar26._0_8_ = (ulong)(bVar4 & 1) * auVar22._0_8_;
      auVar26._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar22._16_8_;
      auVar26._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar22._24_8_;
      auVar26._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar22._32_8_;
      auVar26._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar22._40_8_;
      auVar26._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar22._48_8_;
      auVar26._56_8_ = (uVar6 >> 7) * auVar22._56_8_;
      auVar22 = vpsubq_avx512f(auVar24,auVar26);
      auVar22 = vpsraq_avx512f(auVar22,3);
      auVar22 = vpmaxuq_avx512f(auVar25,auVar22);
    } while (((lVar8 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar14);
    auVar18 = vmovdqa64_avx512f(auVar22);
    auVar19._0_8_ = (ulong)(bVar4 & 1) * auVar18._0_8_ | (ulong)!(bool)(bVar4 & 1) * auVar25._0_8_;
    bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar19._8_8_ = (ulong)bVar5 * auVar18._8_8_ | (ulong)!bVar5 * auVar25._8_8_;
    bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar19._16_8_ = (ulong)bVar5 * auVar18._16_8_ | (ulong)!bVar5 * auVar25._16_8_;
    bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar19._24_8_ = (ulong)bVar5 * auVar18._24_8_ | (ulong)!bVar5 * auVar25._24_8_;
    bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar19._32_8_ = (ulong)bVar5 * auVar18._32_8_ | (ulong)!bVar5 * auVar25._32_8_;
    bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar19._40_8_ = (ulong)bVar5 * auVar18._40_8_ | (ulong)!bVar5 * auVar25._40_8_;
    bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar19._48_8_ = (ulong)bVar5 * auVar18._48_8_ | (ulong)!bVar5 * auVar25._48_8_;
    auVar19._56_8_ = (uVar6 >> 7) * auVar18._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar25._56_8_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpmaxuq_avx512f(auVar19,ZEXT3264(auVar17));
    auVar15 = vpmaxuq_avx512vl(auVar18._0_16_,auVar18._16_16_);
    auVar16 = vpshufd_avx(auVar15,0xee);
    auVar16 = vpmaxuq_avx512vl(auVar15,auVar16);
    uVar14 = auVar16._0_8_;
  }
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar14;
  uVar14 = SUB168(auVar16 * ZEXT816(0xc),0);
  if (SUB168(auVar16 * ZEXT816(0xc),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  __s_00 = (rc_data *)operator_new__(uVar14);
  memset(__s_00,0,uVar14);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_false>
  ._M_head_impl = __s_00;
  uVar14 = (long)m_ * 8;
  if (m_ < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  __s_01 = (bound_factor *)operator_new__(uVar14);
  memset(__s_01,0,uVar14);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_false>
  ._M_head_impl = __s_01;
  uVar14 = 0xffffffffffffffff;
  if (-1 < m_) {
    uVar14 = (long)m_ << 2;
  }
  pfVar7 = (float *)operator_new__(uVar14);
  iVar9 = 0;
  memset(pfVar7,0,uVar14);
  (this->pi)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar7;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    uVar14 = 0;
    pmVar2 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      __s_01[uVar14].negative_factor = 0;
      pmVar1 = pmVar2 + uVar14;
      iVar13 = pmVar1->min;
      __s_01[uVar14].value = iVar13;
      pfVar10 = *(pointer *)
                 &(pmVar1->elements).
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar3 = *(pointer *)
                ((long)&(pmVar1->elements).
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar10 != pfVar3) {
        iVar13 = 0;
        piVar12 = __s + iVar9;
        do {
          if ((pfVar10->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_equalities_101coeff();
            goto LAB_002aae4b;
          }
          *piVar12 = pfVar10->factor;
          if (pfVar10->factor < 0) {
            iVar13 = iVar13 + 1;
            __s_01[uVar14].negative_factor = iVar13;
          }
          pfVar10 = pfVar10 + 1;
          piVar12 = piVar12 + 1;
          iVar9 = iVar9 + 1;
        } while (pfVar10 != pfVar3);
        iVar13 = pmVar1->min;
      }
      if (iVar13 != pmVar1->max) {
LAB_002aae4b:
        itm::solver_equalities_101coeff();
        operator_delete__(__s_01);
        __s[0x1a] = 0;
        __s[0x1b] = 0;
        if (*(void **)(__s + 0x18) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x18));
        }
        __s[0x18] = 0;
        __s[0x19] = 0;
        if (*(void **)(__s + 0x16) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x16));
        }
        __s[0x16] = 0;
        __s[0x17] = 0;
        if (*(void **)(__s + 0x14) != (void *)0x0) {
          operator_delete__(*(void **)(__s + 0x14));
        }
        __s[0x14] = 0;
        __s[0x15] = 0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        if (*(FILE **)__s != (FILE *)0x0) {
          fclose(*(FILE **)__s);
        }
        _Unwind_Resume(extraout_RAX);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)m_);
  }
  return;
}

Assistant:

solver_equalities_101coeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_equalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0; i != m; ++i) {
            b[i].negative_factor = 0;
            b[i].value = csts[i].min;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor < 0)
                    ++b[i].negative_factor;
            }

            bx_ensures(csts[i].min == csts[i].max);
        }
    }